

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O3

int ps_add_word(ps_decoder_t *ps,char *word,char *phones,int update)

{
  long *plVar1;
  uint max_ptr;
  int iVar2;
  s3wid_t wid;
  int32 iVar3;
  char *line;
  char **ptr;
  s3cipid_t *p;
  hash_iter_t *itor;
  s3wid_t sVar4;
  ulong uVar5;
  
  line = __ckd_salloc__(phones,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                        ,0x3b8);
  max_ptr = str2words(line,(char **)0x0,0);
  ptr = (char **)__ckd_calloc__((long)(int)max_ptr,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                                ,0x3ba);
  str2words(line,ptr,max_ptr);
  p = (s3cipid_t *)
      __ckd_calloc__((long)(int)max_ptr,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                     ,0x3bc);
  if (0 < (int)max_ptr) {
    uVar5 = 0;
    do {
      iVar2 = bin_mdef_ciphone_id(ps->acmod->mdef,ptr[uVar5]);
      p[uVar5] = (short)iVar2;
      if ((short)iVar2 == -1) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                ,0x3c1,"Unknown phone %s in phone string %s\n",ptr[uVar5],line);
        ckd_free(ptr);
        ckd_free(line);
        ckd_free(p);
        return -1;
      }
      uVar5 = uVar5 + 1;
    } while (max_ptr != uVar5);
  }
  ckd_free(ptr);
  ckd_free(line);
  wid = dict_add_word(ps->dict,word,p,max_ptr);
  ckd_free(p);
  sVar4 = -1;
  if (wid != -1) {
    dict2pid_add_word(ps->d2p,wid);
    for (itor = hash_table_iter(ps->searches); sVar4 = wid, itor != (hash_iter_t *)0x0;
        itor = hash_table_iter_next(itor)) {
      plVar1 = (long *)itor->ent->val;
      iVar2 = strcmp("ngram",(char *)plVar1[1]);
      if ((iVar2 == 0) &&
         (iVar3 = ngram_model_add_word((ngram_model_t *)plVar1[0xe],word,1.0), iVar3 == -1)) {
        hash_table_iter_free(itor);
        return -1;
      }
      if ((update != 0) &&
         (iVar2 = (**(code **)(*plVar1 + 0x18))(plVar1,ps->dict,ps->d2p), iVar2 < 0)) {
        hash_table_iter_free(itor);
        return iVar2;
      }
    }
  }
  return sVar4;
}

Assistant:

int
ps_add_word(ps_decoder_t *ps,
            char const *word,
            char const *phones,
            int update)
{
    int32 wid;
    s3cipid_t *pron;
    hash_iter_t *search_it;
    char **phonestr, *tmp;
    int np, i, rv;

    /* Parse phones into an array of phone IDs. */
    tmp = ckd_salloc(phones);
    np = str2words(tmp, NULL, 0);
    phonestr = ckd_calloc(np, sizeof(*phonestr));
    str2words(tmp, phonestr, np);
    pron = ckd_calloc(np, sizeof(*pron));
    for (i = 0; i < np; ++i) {
        pron[i] = bin_mdef_ciphone_id(ps->acmod->mdef, phonestr[i]);
        if (pron[i] == -1) {
            E_ERROR("Unknown phone %s in phone string %s\n",
                    phonestr[i], tmp);
            ckd_free(phonestr);
            ckd_free(tmp);
            ckd_free(pron);
            return -1;
        }
    }
    /* No longer needed. */
    ckd_free(phonestr);
    ckd_free(tmp);

    /* Add it to the dictionary. */
    if ((wid = dict_add_word(ps->dict, word, pron, np)) == -1) {
        ckd_free(pron);
        return -1;
    }
    /* No longer needed. */
    ckd_free(pron);

    /* Now we also have to add it to dict2pid. */
    dict2pid_add_word(ps->d2p, wid);

    /* TODO: we definitely need to refactor this */
    for (search_it = hash_table_iter(ps->searches); search_it;
         search_it = hash_table_iter_next(search_it)) {
        ps_search_t *search = hash_entry_val(search_it->ent);
        if (!strcmp(PS_SEARCH_TYPE_NGRAM, ps_search_type(search))) {
            ngram_model_t *lmset = ((ngram_search_t *) search)->lmset;
            if (ngram_model_add_word(lmset, word, 1.0) == NGRAM_INVALID_WID) {
                hash_table_iter_free(search_it);
                return -1;
            }
        }

        if (update) {
            if ((rv = ps_search_reinit(search, ps->dict, ps->d2p)) < 0) {
                hash_table_iter_free(search_it);
                return rv;
            }
        }
    }

    /* Rebuild the widmap and search tree if requested. */
    return wid;
}